

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FieldDescriptor *pFVar7;
  Message *f;
  Parser *this_00;
  Token *output;
  uint64 *output_00;
  LocationRecorder *in_RDX;
  undefined8 *in_RDI;
  int in_R8D;
  string value_3;
  double value_2;
  uint64 max_value;
  uint64 value_1;
  string value;
  bool is_negative;
  LocationRecorder value_location;
  LocationRecorder part_location_1;
  LocationRecorder part_location;
  LocationRecorder name_location;
  UninterpretedOption *uninterpreted_option;
  LocationRecorder location;
  Reflection *reflection;
  FieldDescriptor *uninterpreted_option_field;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  Parser *in_stack_fffffffffffffc80;
  allocator *paVar8;
  undefined4 in_stack_fffffffffffffc88;
  LogLevel in_stack_fffffffffffffc8c;
  Parser *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  LocationRecorder *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  Message *in_stack_fffffffffffffcb0;
  Reflection *in_stack_fffffffffffffcb8;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  string *in_stack_fffffffffffffcd0;
  string *output_01;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  FieldDescriptor *in_stack_fffffffffffffce8;
  Message *in_stack_fffffffffffffcf0;
  Reflection *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd09;
  undefined1 in_stack_fffffffffffffd0a;
  undefined1 in_stack_fffffffffffffd0b;
  int in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd11;
  undefined1 in_stack_fffffffffffffd12;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  LocationRecorder *part_location_00;
  undefined4 in_stack_fffffffffffffd40;
  Parser *in_stack_fffffffffffffd48;
  allocator local_279;
  string local_278 [32];
  string local_258 [39];
  allocator local_231;
  string local_230 [40];
  ulong local_208;
  string local_1f8;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [103];
  byte local_141;
  Parser *local_e0;
  uint local_d4;
  Reflection *local_b8;
  byte local_a9;
  allocator local_59;
  string local_58 [32];
  FieldDescriptor *local_38;
  int local_2c;
  LocationRecorder *local_20;
  byte local_1;
  
  local_2c = in_R8D;
  local_20 = in_RDX;
  Message::GetDescriptor((Message *)in_stack_fffffffffffffc80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"uninterpreted_option",&local_59);
  pFVar7 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                      (string *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_a9 = 0;
  local_38 = pFVar7;
  if (pFVar7 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    local_a9 = 1;
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffc80,
               (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    in_stack_fffffffffffffd48 =
         (Parser *)
         internal::LogMessage::operator<<
                   ((LogMessage *)in_stack_fffffffffffffc80,
                    (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffc80,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  }
  if ((local_a9 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x60a977);
  }
  local_b8 = Message::GetReflection((Message *)in_stack_fffffffffffffc80);
  iVar5 = FieldDescriptor::number(local_38);
  Reflection::FieldSize
            (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)in_stack_fffffffffffffc90,
             (LocationRecorder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),(int)in_stack_fffffffffffffc80);
  part_location_00 = local_20;
  if ((local_2c == 1) &&
     (in_stack_fffffffffffffd37 =
           Consume((Parser *)
                   CONCAT44(in_stack_fffffffffffffd0c,
                            CONCAT13(in_stack_fffffffffffffd0b,
                                     CONCAT12(in_stack_fffffffffffffd0a,
                                              CONCAT11(in_stack_fffffffffffffd09,
                                                       in_stack_fffffffffffffd08)))),
                   in_stack_fffffffffffffd00), part_location_00 = local_20,
     !(bool)in_stack_fffffffffffffd37)) {
    local_1 = 0;
    local_d4 = 1;
    goto LAB_0060b705;
  }
  Message::GetReflection((Message *)in_stack_fffffffffffffc80);
  f = Reflection::AddMessage
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                 (FieldDescriptor *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 (MessageFactory *)in_stack_fffffffffffffca0);
  this_00 = (Parser *)
            internal::down_cast<google::protobuf::UninterpretedOption*,google::protobuf::Message>(f)
  ;
  local_e0 = this_00;
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)in_stack_fffffffffffffc90,
             (LocationRecorder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
  LocationRecorder::RecordLegacyLocation
            (in_stack_fffffffffffffca0,
             (Message *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (ErrorLocation)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  iVar6 = UninterpretedOption::name_size((UninterpretedOption *)0x60ab87);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)in_stack_fffffffffffffc90,
             (LocationRecorder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
  uVar1 = ParseOptionNamePart(in_stack_fffffffffffffd48,
                              (UninterpretedOption *)CONCAT44(iVar5,in_stack_fffffffffffffd40),
                              part_location_00,
                              (FileDescriptorProto *)
                              CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  if (!(bool)uVar1) {
    local_1 = 0;
  }
  local_d4 = (uint)!(bool)uVar1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffc90);
  while (local_d4 == 0) {
    in_stack_fffffffffffffd12 =
         LookingAt(in_stack_fffffffffffffc80,
                   (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (!(bool)in_stack_fffffffffffffd12) {
      local_d4 = 0;
      break;
    }
    in_stack_fffffffffffffd11 =
         Consume((Parser *)
                 CONCAT44(in_stack_fffffffffffffd0c,
                          CONCAT13(in_stack_fffffffffffffd0b,
                                   CONCAT12(in_stack_fffffffffffffd0a,
                                            CONCAT11(in_stack_fffffffffffffd09,
                                                     in_stack_fffffffffffffd08)))),
                 in_stack_fffffffffffffd00);
    if (!(bool)in_stack_fffffffffffffd11) {
      local_1 = 0;
      local_d4 = 1;
      break;
    }
    in_stack_fffffffffffffd0c = UninterpretedOption::name_size((UninterpretedOption *)0x60ace8);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)in_stack_fffffffffffffc90,
               (LocationRecorder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    in_stack_fffffffffffffd0b =
         ParseOptionNamePart(in_stack_fffffffffffffd48,
                             (UninterpretedOption *)CONCAT44(iVar5,in_stack_fffffffffffffd40),
                             part_location_00,
                             (FileDescriptorProto *)
                             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    if (!(bool)in_stack_fffffffffffffd0b) {
      local_1 = 0;
    }
    local_d4 = (uint)!(bool)in_stack_fffffffffffffd0b;
    LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffc90);
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffc90);
  if (local_d4 != 0) goto LAB_0060b705;
  uVar2 = Consume((Parser *)
                  CONCAT44(in_stack_fffffffffffffd0c,
                           CONCAT13(in_stack_fffffffffffffd0b,
                                    CONCAT12(in_stack_fffffffffffffd0a,
                                             CONCAT11(in_stack_fffffffffffffd09,
                                                      in_stack_fffffffffffffd08)))),
                  in_stack_fffffffffffffd00);
  if (!(bool)uVar2) {
    local_1 = 0;
    local_d4 = 1;
    goto LAB_0060b705;
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)in_stack_fffffffffffffc80,
             (LocationRecorder *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  LocationRecorder::RecordLegacyLocation
            (in_stack_fffffffffffffca0,
             (Message *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
             (ErrorLocation)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  uVar3 = TryConsume((Parser *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                     (char *)in_stack_fffffffffffffc80);
  local_141 = uVar3;
  output = io::Tokenizer::current((Tokenizer *)*in_RDI);
  output_00 = (uint64 *)(ulong)output->type;
  switch(output_00) {
  case (uint64 *)0x0:
    internal::LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffc80,
               (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffc80,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    internal::LogMessage::~LogMessage((LogMessage *)0x60af54);
    local_1 = 0;
    local_d4 = 1;
    break;
  case (uint64 *)0x1:
    paVar8 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a8,"Unexpected end of stream while parsing option value.",paVar8);
    AddError(in_stack_fffffffffffffc90,
             (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    local_1 = 0;
    local_d4 = 1;
    break;
  case (uint64 *)0x2:
    LocationRecorder::AddPath
              ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    if ((local_141 & 1) == 0) {
      output_01 = &local_1f8;
      std::__cxx11::string::string((string *)output_01);
      bVar4 = ConsumeIdentifier((Parser *)
                                CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                output_01,
                                (char *)CONCAT17(in_stack_fffffffffffffccf,
                                                 CONCAT16(in_stack_fffffffffffffcce,
                                                          in_stack_fffffffffffffcc8)));
      if (bVar4) {
        UninterpretedOption::set_identifier_value
                  ((UninterpretedOption *)in_stack_fffffffffffffc80,
                   (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_d4 = 4;
      }
      else {
        local_1 = 0;
        local_d4 = 1;
      }
      std::__cxx11::string::~string((string *)&local_1f8);
joined_r0x0060b51c:
      if (local_d4 == 4) goto switchD_0060aedd_default;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Invalid \'-\' symbol before identifier.",&local_1d1);
      AddError(in_stack_fffffffffffffc90,
               (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      local_1 = 0;
      local_d4 = 1;
    }
    break;
  case (uint64 *)0x3:
    local_208 = (ulong)(local_141 & 1) - 1 | 0x8000000000000000;
    bVar4 = ConsumeInteger64((Parser *)
                             CONCAT44(in_stack_fffffffffffffd0c,
                                      CONCAT13(in_stack_fffffffffffffd0b,
                                               CONCAT12(uVar2,CONCAT11(uVar3,
                                                  in_stack_fffffffffffffd08)))),(uint64)output,
                             output_00,(char *)in_stack_fffffffffffffcf0);
    if (bVar4) {
      if ((local_141 & 1) == 0) {
        LocationRecorder::AddPath
                  ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        UninterpretedOption::set_positive_int_value
                  ((UninterpretedOption *)in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      else {
        LocationRecorder::AddPath
                  ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        UninterpretedOption::set_negative_int_value
                  ((UninterpretedOption *)in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      goto switchD_0060aedd_default;
    }
    local_1 = 0;
    local_d4 = 1;
    break;
  case (uint64 *)0x4:
    LocationRecorder::AddPath
              ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    bVar4 = ConsumeNumber((Parser *)
                          CONCAT44(in_stack_fffffffffffffd0c,
                                   CONCAT13(in_stack_fffffffffffffd0b,
                                            CONCAT12(uVar2,CONCAT11(uVar3,in_stack_fffffffffffffd08)
                                                    ))),(double *)output,(char *)output_00);
    if (bVar4) {
      UninterpretedOption::set_double_value
                ((UninterpretedOption *)in_stack_fffffffffffffc80,
                 (double)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      goto switchD_0060aedd_default;
    }
    local_1 = 0;
    local_d4 = 1;
    break;
  case (uint64 *)0x5:
    LocationRecorder::AddPath
              ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    if ((local_141 & 1) == 0) {
      std::__cxx11::string::string(local_258);
      bVar4 = ConsumeString((Parser *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                            in_stack_fffffffffffffcd0,
                            (char *)CONCAT17(in_stack_fffffffffffffccf,
                                             CONCAT16(in_stack_fffffffffffffcce,
                                                      in_stack_fffffffffffffcc8)));
      if (bVar4) {
        UninterpretedOption::set_string_value
                  ((UninterpretedOption *)in_stack_fffffffffffffc80,
                   (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_d4 = 4;
      }
      else {
        local_1 = 0;
        local_d4 = 1;
      }
      std::__cxx11::string::~string(local_258);
      goto joined_r0x0060b51c;
    }
    paVar8 = &local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"Invalid \'-\' symbol before string.",paVar8);
    AddError(in_stack_fffffffffffffc90,
             (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    local_1 = 0;
    local_d4 = 1;
    break;
  case (uint64 *)0x6:
    bVar4 = LookingAt(in_stack_fffffffffffffc80,
                      (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (bVar4) {
      LocationRecorder::AddPath
                ((LocationRecorder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      in_stack_fffffffffffffc90 =
           (Parser *)
           UninterpretedOption::mutable_aggregate_value_abi_cxx11_((UninterpretedOption *)0x60b56c);
      bVar4 = ParseUninterpretedBlock
                        ((Parser *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                         in_stack_fffffffffffffcd0);
      if (bVar4) goto switchD_0060aedd_default;
      local_1 = 0;
      local_d4 = 1;
    }
    else {
      paVar8 = &local_279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,"Expected option value.",paVar8);
      AddError(in_stack_fffffffffffffc90,
               (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      local_1 = 0;
      local_d4 = 1;
    }
    break;
  default:
switchD_0060aedd_default:
    local_d4 = 0;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffc90);
  if (local_d4 == 0) {
    if ((local_2c != 1) ||
       (bVar4 = ConsumeEndOfDeclaration
                          (this_00,(char *)CONCAT44(iVar6,CONCAT13(uVar1,CONCAT12(
                                                  in_stack_fffffffffffffd12,
                                                  CONCAT11(in_stack_fffffffffffffd11,
                                                           in_stack_fffffffffffffd10)))),
                           (LocationRecorder *)
                           CONCAT44(in_stack_fffffffffffffd0c,
                                    CONCAT13(in_stack_fffffffffffffd0b,
                                             CONCAT12(uVar2,CONCAT11(uVar3,in_stack_fffffffffffffd08
                                                                    ))))), bVar4)) {
      local_1 = 1;
      local_d4 = 1;
    }
    else {
      local_1 = 0;
      local_d4 = 1;
    }
  }
LAB_0060b705:
  LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffc90);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option =
      down_cast<UninterpretedOption*>(options->GetReflection()->AddMessage(
          options, uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        std::string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              static_cast<int64>(-value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        std::string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}